

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O1

int __thiscall
tcmalloc::CentralFreeList::FetchFromOneSpans(CentralFreeList *this,int N,void **start,void **end)

{
  Span *span;
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if ((this->nonempty_).next == &this->nonempty_) {
    lVar3 = 0;
  }
  else {
    span = (this->nonempty_).next;
    lVar3 = 0;
    puVar1 = (undefined8 *)(span->field_4).objects;
    do {
      puVar2 = puVar1;
      puVar1 = (undefined8 *)*puVar2;
      lVar3 = lVar3 + 1;
      if (N <= (int)lVar3) break;
    } while (puVar1 != (undefined8 *)0x0);
    if (puVar1 == (undefined8 *)0x0) {
      DLL_Remove(span);
      DLL_Prepend(&this->empty_,span);
    }
    *start = (void *)span->field_4;
    *end = puVar2;
    (span->field_4).objects = puVar1;
    *(undefined8 *)*end = 0;
    *(short *)&span->field_0x28 = (short)*(undefined4 *)&span->field_0x28 + (short)lVar3;
    this->counter_ = this->counter_ - lVar3;
  }
  return (int)lVar3;
}

Assistant:

int CentralFreeList::FetchFromOneSpans(int N, void **start, void **end) {
  if (tcmalloc::DLL_IsEmpty(&nonempty_)) return 0;
  Span* span = nonempty_.next;

  ASSERT(span->objects != nullptr);

  int result = 0;
  void *prev, *curr;
  curr = span->objects;
  do {
    prev = curr;
    curr = *(reinterpret_cast<void**>(curr));
  } while (++result < N && curr != nullptr);

  if (curr == nullptr) {
    // Move to empty list
    tcmalloc::DLL_Remove(span);
    tcmalloc::DLL_Prepend(&empty_, span);
  }

  *start = span->objects;
  *end = prev;
  span->objects = curr;
  SLL_SetNext(*end, nullptr);
  span->refcount += result;
  counter_ -= result;
  return result;
}